

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O2

float * stbir_resize_float_linear
                  (float *input_pixels,int input_w,int input_h,int input_stride_in_bytes,
                  float *output_pixels,int output_w,int output_h,int output_stride_in_bytes,
                  stbir_pixel_layout pixel_layout)

{
  int iVar1;
  int opitch;
  float *optr;
  STBIR_RESIZE local_f8;
  
  iVar1 = stbir__check_output_stuff
                    (&optr,&opitch,output_pixels,4,output_w,output_h,output_stride_in_bytes,
                     stbir__pixel_layout_convert_public_to_internal[pixel_layout]);
  if (iVar1 != 0) {
    if (optr != (float *)0x0) {
      output_pixels = optr;
    }
    local_f8.user_data = &local_f8;
    local_f8.output_h = output_h;
    local_f8.output_stride_in_bytes = opitch;
    local_f8.fast_alpha = 0;
    local_f8.input_cb = (stbir_input_callback *)0x0;
    local_f8.output_cb = (stbir_output_callback *)0x0;
    local_f8.called_alloc = 0;
    local_f8.input_s0 = 0.0;
    local_f8.input_t0 = 0.0;
    local_f8.horizontal_filter = STBIR_FILTER_DEFAULT;
    local_f8.vertical_filter = STBIR_FILTER_DEFAULT;
    local_f8.horizontal_edge = STBIR_EDGE_CLAMP;
    local_f8.vertical_edge = STBIR_EDGE_CLAMP;
    local_f8.horizontal_filter_kernel = (stbir__kernel_callback *)0x0;
    local_f8.horizontal_filter_support = (stbir__support_callback *)0x0;
    local_f8.vertical_filter_kernel = (stbir__kernel_callback *)0x0;
    local_f8.vertical_filter_support = (stbir__support_callback *)0x0;
    local_f8.samplers = (stbir__info *)0x0;
    local_f8.input_s1 = 1.0;
    local_f8.input_t1 = 1.0;
    local_f8.output_subx = 0;
    local_f8.output_suby = 0;
    local_f8.output_subh = output_h;
    local_f8.input_data_type = STBIR_TYPE_FLOAT;
    local_f8.output_data_type = STBIR_TYPE_FLOAT;
    local_f8.input_pixel_layout_public = pixel_layout;
    local_f8.output_pixel_layout_public = pixel_layout;
    local_f8.needs_rebuild = 1;
    local_f8.input_pixels = input_pixels;
    local_f8.input_w = input_w;
    local_f8.input_h = input_h;
    local_f8.output_pixels = output_pixels;
    local_f8.output_w = output_w;
    local_f8.output_subw = output_w;
    local_f8.input_stride_in_bytes = input_stride_in_bytes;
    iVar1 = stbir_resize_extended((STBIR_RESIZE *)local_f8.user_data);
    if (iVar1 != 0) {
      return output_pixels;
    }
    free(optr);
  }
  return (float *)0x0;
}

Assistant:

STBIRDEF float * stbir_resize_float_linear( const float *input_pixels , int input_w , int input_h, int input_stride_in_bytes,
                                                  float *output_pixels, int output_w, int output_h, int output_stride_in_bytes,
                                                  stbir_pixel_layout pixel_layout )
{
  STBIR_RESIZE resize;
  float * optr;
  int opitch;

  if ( !stbir__check_output_stuff( (void**)&optr, &opitch, output_pixels, sizeof( float ), output_w, output_h, output_stride_in_bytes, stbir__pixel_layout_convert_public_to_internal[ pixel_layout ] ) )
    return 0;

  stbir_resize_init( &resize,
                     input_pixels,  input_w,  input_h,  input_stride_in_bytes,
                     (optr) ? optr : output_pixels, output_w, output_h, opitch,
                     pixel_layout, STBIR_TYPE_FLOAT );

  if ( !stbir_resize_extended( &resize ) )
  {
    if ( optr )
      STBIR_FREE( optr, 0 );
    return 0;
  }

  return (optr) ? optr : output_pixels;
}